

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

void __thiscall Rml::Context::CreateDragClone(Context *this,Element *element)

{
  Element *pEVar1;
  code *pcVar2;
  bool bVar3;
  ElementDocument *this_00;
  pointer pEVar4;
  allocator<char> local_219;
  String local_218;
  Property local_1f8;
  Property local_1a8;
  Property local_158;
  Property local_108;
  Property local_b8;
  Element *local_68;
  Element *parent;
  Vector2f projected_mouse_position;
  Vector2f absolute_pos;
  shared_ptr<Rml::StyleSheetContainer> local_48;
  ElementDocument *local_38;
  ElementDocument *document;
  undefined1 local_20 [8];
  ElementPtr element_drag_clone;
  Element *element_local;
  Context *this_local;
  
  element_drag_clone._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl =
       (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
       (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)element;
  bVar3 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->cursor_proxy);
  if ((!bVar3) &&
     (bVar3 = Assert("Unable to create drag clone, no cursor proxy document.",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Context.cpp"
                     ,0x4df), !bVar3)) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  ReleaseDragClone(this);
  Element::Clone((Element *)local_20);
  bVar3 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_20);
  if (bVar3) {
    local_38 = Element::GetOwnerDocument
                         ((Element *)
                          element_drag_clone._M_t.
                          super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                          super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                          super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
    if (local_38 != (ElementDocument *)0x0) {
      this_00 = (ElementDocument *)
                ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator*
                          (&this->cursor_proxy);
      ::std::shared_ptr<Rml::StyleSheetContainer>::shared_ptr
                (&local_48,&local_38->style_sheet_container);
      ElementDocument::SetStyleSheetContainer(this_00,&local_48);
      ::std::shared_ptr<Rml::StyleSheetContainer>::~shared_ptr(&local_48);
    }
    pEVar4 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get
                       ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)local_20);
    this->drag_clone = pEVar4;
    pEVar4 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                       (&this->cursor_proxy);
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::unique_ptr
              ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)&absolute_pos,
               (unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)local_20);
    Element::AppendChild(pEVar4,(ElementPtr *)&absolute_pos,true);
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
              ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)&absolute_pos);
    projected_mouse_position =
         Element::GetAbsoluteOffset
                   ((Element *)
                    element_drag_clone._M_t.
                    super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                    super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                    super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,Border);
    parent = (Element *)Vector2::operator_cast_to_Vector2((Vector2 *)&this->mouse_position);
    local_68 = Element::GetParentNode
                         ((Element *)
                          element_drag_clone._M_t.
                          super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                          super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                          super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
    if (local_68 != (Element *)0x0) {
      Element::Project(local_68,(Vector2f *)&parent);
    }
    pEVar1 = this->drag_clone;
    Property::Property<Rml::Style::Position,Rml::Style::Position>(&local_b8,Absolute);
    Element::SetProperty(pEVar1,Position,&local_b8);
    Property::~Property(&local_b8);
    pEVar1 = this->drag_clone;
    Property::Property<float>(&local_108,projected_mouse_position.x - parent._0_4_,PX,-1);
    Element::SetProperty(pEVar1,Left,&local_108);
    Property::~Property(&local_108);
    pEVar1 = this->drag_clone;
    Property::Property<float>(&local_158,projected_mouse_position.y - parent._4_4_,PX,-1);
    Element::SetProperty(pEVar1,Top,&local_158);
    Property::~Property(&local_158);
    pEVar1 = this->drag_clone;
    Property::Property<float>(&local_1a8,0.0,PX,-1);
    Element::SetProperty(pEVar1,MarginLeft,&local_1a8);
    Property::~Property(&local_1a8);
    pEVar1 = this->drag_clone;
    Property::Property<float>(&local_1f8,0.0,PX,-1);
    Element::SetProperty(pEVar1,MarginTop,&local_1f8);
    Property::~Property(&local_1f8);
    pEVar1 = this->drag_clone;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"drag",&local_219);
    Element::SetPseudoClass(pEVar1,&local_218,true);
    ::std::__cxx11::string::~string((string *)&local_218);
    ::std::allocator<char>::~allocator(&local_219);
    document._0_4_ = 0;
  }
  else {
    Log::Message(LT_ERROR,"Unable to duplicate drag clone.");
    document._0_4_ = 1;
  }
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
            ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)local_20);
  return;
}

Assistant:

void Context::CreateDragClone(Element* element)
{
	RMLUI_ASSERTMSG(cursor_proxy, "Unable to create drag clone, no cursor proxy document.");

	ReleaseDragClone();

	// Instance the drag clone.
	ElementPtr element_drag_clone = element->Clone();
	if (!element_drag_clone)
	{
		Log::Message(Log::LT_ERROR, "Unable to duplicate drag clone.");
		return;
	}

	// Set the style sheet on the cursor proxy.
	if (ElementDocument* document = element->GetOwnerDocument())
	{
		// Borrow the target document's style sheet. Sharing style sheet containers should be used with care, and
		// only within the same context.
		static_cast<ElementDocument&>(*cursor_proxy).SetStyleSheetContainer(document->style_sheet_container);
	}

	drag_clone = element_drag_clone.get();

	// Append the clone to the cursor proxy element.
	cursor_proxy->AppendChild(std::move(element_drag_clone));

	// Position the clone. Use projected mouse coordinates to handle any ancestor transforms.
	const Vector2f absolute_pos = element->GetAbsoluteOffset(BoxArea::Border);
	Vector2f projected_mouse_position = Vector2f(mouse_position);
	if (Element* parent = element->GetParentNode())
		parent->Project(projected_mouse_position);

	drag_clone->SetProperty(PropertyId::Position, Property(Style::Position::Absolute));
	drag_clone->SetProperty(PropertyId::Left, Property(absolute_pos.x - projected_mouse_position.x, Unit::PX));
	drag_clone->SetProperty(PropertyId::Top, Property(absolute_pos.y - projected_mouse_position.y, Unit::PX));
	// We remove margins so that percentage- and auto-margins are evaluated correctly.
	drag_clone->SetProperty(PropertyId::MarginLeft, Property(0.f, Unit::PX));
	drag_clone->SetProperty(PropertyId::MarginTop, Property(0.f, Unit::PX));
	drag_clone->SetPseudoClass("drag", true);
}